

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_n_1<4>
          (ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this,ymfm_output<3> *output,
          uint32_t numsamples)

{
  uint uVar1;
  int32_t *piVar2;
  
  if (numsamples != 0) {
    uVar1 = this->m_sampindex;
    piVar2 = output->data + 2;
    do {
      if ((uVar1 & 3) == 0) {
        ssg_engine::clock(this->m_ssg);
        ssg_engine::output(this->m_ssg,&this->m_last);
      }
      *piVar2 = (((this->m_last).data[1] + (this->m_last).data[0] + (this->m_last).data[2]) * 2) / 3
      ;
      uVar1 = this->m_sampindex + 1;
      this->m_sampindex = uVar1;
      piVar2 = piVar2 + 3;
      numsamples = numsamples - 1;
    } while (numsamples != 0);
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_n_1(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		if (m_sampindex % Multiplier == 0)
		{
			m_ssg.clock();
			m_ssg.output(m_last);
		}
		write_to_output(output, m_last.data[0], m_last.data[1], m_last.data[2]);
	}
}